

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,FPolyObj *poly,FPolyObj *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  DAngle angle;
  DVector2 delta;
  double local_38;
  DAngle local_30;
  DVector2 local_28;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    local_38 = (poly->Angle).Degrees;
    local_28.X = (poly->StartSpot).pos.X;
    local_28.Y = (poly->StartSpot).pos.Y;
    pFVar2 = Serialize(arc,"angle",&local_38,(double *)0x0);
    pFVar2 = FSerializer::Array<double>(pFVar2,"pos",&local_28.X,(double *)0x0,2,true);
    Serialize(pFVar2,"interpolation",(DObject **)&poly->interpolation,(DObject **)0x0,(bool *)0x0);
    pFVar2 = Serialize(pFVar2,"blocked",&poly->bBlocked,(bool *)0x0);
    pFVar2 = Serialize(pFVar2,"hasportals",&poly->bHasPortals,(uint8_t *)0x0);
    Serialize(pFVar2,"specialdata",(DObject **)&poly->specialdata,(DObject **)0x0,(bool *)0x0);
    FSerializer::EndObject(pFVar2);
    if (arc->r != (FReader *)0x0) {
      local_30.Degrees = local_38;
      FPolyObj::RotatePolyobj(poly,&local_30,true);
      local_28.X = local_28.X - (poly->StartSpot).pos.X;
      local_28.Y = local_28.Y - (poly->StartSpot).pos.Y;
      FPolyObj::MovePolyobj(poly,&local_28,true);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FPolyObj &poly, FPolyObj *def)
{
	if (arc.BeginObject(key))
	{
		DAngle angle = poly.Angle;
		DVector2 delta = poly.StartSpot.pos;
		arc("angle", angle)
			("pos", delta)
			("interpolation", poly.interpolation)
			("blocked", poly.bBlocked)
			("hasportals", poly.bHasPortals)
			("specialdata", poly.specialdata)
			.EndObject();

		if (arc.isReading())
		{
			poly.RotatePolyobj(angle, true);
			delta -= poly.StartSpot.pos;
			poly.MovePolyobj(delta, true);
		}
	}
	return arc;
}